

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbmp.cpp
# Opt level: O1

void BMP_GetPixelRGB(BMP *bmp,unsigned_long x,unsigned_long y,uchar *r,uchar *g,uchar *b)

{
  ushort uVar1;
  ulong uVar2;
  byte *pbVar3;
  
  if (((bmp != (BMP *)0x0) && (x < (bmp->Header).Width)) &&
     (uVar2 = (bmp->Header).Height, y < uVar2)) {
    BMP_LAST_ERROR_CODE = BMP_OK;
    uVar1 = (bmp->Header).BitsPerPixel;
    pbVar3 = bmp->Data +
             (uVar1 >> 3 & 0xff) * x + (~y + uVar2) * ((bmp->Header).ImageDataSize / uVar2);
    if (uVar1 == 8) {
      pbVar3 = bmp->Palette + (ulong)*pbVar3 * 4;
    }
    if (r != (uchar *)0x0) {
      *r = pbVar3[2];
    }
    if (g != (uchar *)0x0) {
      *g = pbVar3[1];
    }
    if (b != (uchar *)0x0) {
      *b = *pbVar3;
    }
    return;
  }
  BMP_LAST_ERROR_CODE = BMP_INVALID_ARGUMENT;
  return;
}

Assistant:

void BMP_GetPixelRGB( BMP* bmp, UINT x, UINT y, UCHAR* r, UCHAR* g, UCHAR* b )
{
	UCHAR*	pixel;
	UINT	bytes_per_row;
	UCHAR	bytes_per_pixel;

	if ( bmp == NULL || x < 0 || x >= bmp->Header.Width || y < 0 || y >= bmp->Header.Height )
	{
		BMP_LAST_ERROR_CODE = BMP_INVALID_ARGUMENT;
	}
	else
	{
		BMP_LAST_ERROR_CODE = BMP_OK;

		bytes_per_pixel = bmp->Header.BitsPerPixel >> 3;

		/* Row's size is rounded up to the next multiple of 4 bytes */
		bytes_per_row = bmp->Header.ImageDataSize / bmp->Header.Height;

		/* Calculate the location of the relevant pixel (rows are flipped) */
		pixel = bmp->Data + ( ( bmp->Header.Height - y - 1 ) * bytes_per_row + x * bytes_per_pixel );


		/* In indexed color mode the pixel's value is an index within the palette */
		if ( bmp->Header.BitsPerPixel == 8 )
		{
			pixel = bmp->Palette + *pixel * 4;
		}

		/* Note: colors are stored in BGR order */
		if ( r )	*r = *( pixel + 2 );
		if ( g )	*g = *( pixel + 1 );
		if ( b )	*b = *( pixel + 0 );
	}
}